

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

void __thiscall
icu_63::Locale::setKeywordValue
          (Locale *this,StringPiece keywordName,StringPiece keywordValue,UErrorCode *status)

{
  CharString keywordValue_nul;
  CharString keywordName_nul;
  CharString local_b0;
  CharString local_70;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_70.buffer);
  local_70.len = 0;
  *local_70.buffer.ptr = '\0';
  CharString::append(&local_70,keywordName.ptr_,keywordName.length_,status);
  MaybeStackArray<char,_40>::MaybeStackArray(&local_b0.buffer);
  local_b0.len = 0;
  *local_b0.buffer.ptr = '\0';
  CharString::append(&local_b0,keywordValue.ptr_,keywordValue.length_,status);
  setKeywordValue(this,local_70.buffer.ptr,local_b0.buffer.ptr,status);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_b0.buffer);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_70.buffer);
  return;
}

Assistant:

void
Locale::setKeywordValue(StringPiece keywordName,
                        StringPiece keywordValue,
                        UErrorCode& status) {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    const CharString keywordValue_nul(keywordValue, status);
    setKeywordValue(keywordName_nul.data(), keywordValue_nul.data(), status);
}